

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray
          (TGlslangToSpvTraverser *this,TType *glslangType,TConstUnionArray *consts,int *nextConst,
          bool specConstant)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  unsigned_short uVar5;
  uint uVar6;
  TBasicType t;
  int iVar7;
  int iVar8;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar9;
  pointer pTVar10;
  undefined4 extraout_var;
  TConstUnion *pTVar11;
  TString *this_00;
  char *__s;
  double dVar12;
  unsigned_long_long local_488;
  float local_474;
  double local_468;
  unsigned_long_long local_458;
  longlong local_448;
  uint local_434;
  int local_424;
  uint local_414;
  int local_404;
  bool local_3f1;
  float local_3e4;
  uint local_3d4;
  int local_3c4;
  float local_3a4;
  double local_398;
  unsigned_long_long local_388;
  longlong local_378;
  uint local_364;
  int local_354;
  uint local_344;
  int local_334;
  bool local_321;
  float local_314;
  uint local_304;
  int local_2f4;
  uint local_2d4;
  allocator<char> local_2b9;
  string local_2b8;
  Id local_298;
  byte local_291;
  Id scalar;
  Id IStack_28c;
  bool zero_1;
  Id local_288;
  Id local_284;
  Id local_280;
  Id local_27c;
  Id local_278;
  Id local_274;
  Id local_270;
  Id local_26c;
  Id local_268;
  Id local_264;
  byte local_25d;
  uint local_25c;
  uint uStack_258;
  bool zero;
  uint i_1;
  uint numComponents;
  TTypeLoc *local_248;
  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_240;
  const_iterator iter;
  undefined1 local_230 [8];
  TType componentType;
  undefined1 local_190 [4];
  int col;
  TType vectorType;
  undefined1 local_f0 [4];
  int i;
  TType elementType;
  undefined1 local_50 [4];
  Id typeId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvConsts;
  bool specConstant_local;
  int *nextConst_local;
  TConstUnionArray *consts_local;
  TType *glslangType_local;
  TGlslangToSpvTraverser *this_local;
  
  spvConsts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = specConstant;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  elementType.spirvType._4_4_ = convertGlslangToSpvType(this,glslangType,false);
  uVar6 = (*glslangType->_vptr_TType[0x1d])();
  if ((uVar6 & 1) == 0) {
    uVar6 = (*glslangType->_vptr_TType[0x1c])();
    if ((uVar6 & 1) == 0) {
      bVar1 = glslang::TType::isCoopMat(glslangType);
      if (bVar1) {
        t = (*glslangType->_vptr_TType[7])();
        glslang::TType::TType((TType *)local_230,t,EvqTemporary,1,0,0,false);
        iter._M_current._4_4_ =
             createSpvConstantFromConstUnionArray(this,(TType *)local_230,consts,nextConst,false);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                   (value_type *)((long)&iter._M_current + 4));
        glslang::TType::~TType((TType *)local_230);
      }
      else {
        uVar6 = (*glslangType->_vptr_TType[0x25])();
        if ((uVar6 & 1) == 0) {
          iVar7 = (*glslangType->_vptr_TType[0xc])();
          if ((iVar7 < 2) && (bVar1 = glslang::TType::isCoopVecNV(glslangType), !bVar1)) {
            iVar7 = *nextConst;
            iVar8 = glslang::TConstUnionArray::size(consts);
            local_291 = iVar8 <= iVar7;
            local_298 = 0;
            iVar7 = (*glslangType->_vptr_TType[7])();
            switch(iVar7) {
            case 1:
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                dVar12 = glslang::TConstUnion::getDConst(pTVar11);
                local_3e4 = (float)dVar12;
              }
              else {
                local_3e4 = 0.0;
              }
              local_298 = spv::Builder::makeFloatConstant
                                    (&this->builder,local_3e4,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 2:
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_468 = glslang::TConstUnion::getDConst(pTVar11);
              }
              else {
                local_468 = 0.0;
              }
              local_298 = spv::Builder::makeDoubleConstant
                                    (&this->builder,local_468,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 3:
              spv::Builder::addCapability(&this->builder,CapabilityFloat16);
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                dVar12 = glslang::TConstUnion::getDConst(pTVar11);
                local_474 = (float)dVar12;
              }
              else {
                local_474 = 0.0;
              }
              local_298 = spv::Builder::makeFloat16Constant
                                    (&this->builder,local_474,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 4:
              spv::Builder::addCapability(&this->builder,CapabilityInt8);
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                cVar2 = glslang::TConstUnion::getI8Const(pTVar11);
                local_404 = (int)cVar2;
              }
              else {
                local_404 = 0;
              }
              local_298 = spv::Builder::makeInt8Constant
                                    (&this->builder,local_404,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 5:
              spv::Builder::addCapability(&this->builder,CapabilityInt8);
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                bVar3 = glslang::TConstUnion::getU8Const(pTVar11);
                local_414 = (uint)bVar3;
              }
              else {
                local_414 = 0;
              }
              local_298 = spv::Builder::makeUint8Constant
                                    (&this->builder,local_414,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 6:
              spv::Builder::addCapability(&this->builder,CapabilityInt16);
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                sVar4 = glslang::TConstUnion::getI16Const(pTVar11);
                local_424 = (int)sVar4;
              }
              else {
                local_424 = 0;
              }
              local_298 = spv::Builder::makeInt16Constant
                                    (&this->builder,local_424,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 7:
              spv::Builder::addCapability(&this->builder,CapabilityInt16);
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                uVar5 = glslang::TConstUnion::getU16Const(pTVar11);
                local_434 = (uint)uVar5;
              }
              else {
                local_434 = 0;
              }
              local_298 = spv::Builder::makeUint16Constant
                                    (&this->builder,local_434,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 8:
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_3c4 = glslang::TConstUnion::getIConst(pTVar11);
              }
              else {
                local_3c4 = 0;
              }
              local_298 = spv::Builder::makeIntConstant
                                    (&this->builder,local_3c4,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 9:
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_3d4 = glslang::TConstUnion::getUConst(pTVar11);
              }
              else {
                local_3d4 = 0;
              }
              local_298 = spv::Builder::makeUintConstant
                                    (&this->builder,local_3d4,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 10:
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_448 = glslang::TConstUnion::getI64Const(pTVar11);
              }
              else {
                local_448 = 0;
              }
              local_298 = spv::Builder::makeInt64Constant
                                    (&this->builder,local_448,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 0xb:
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_458 = glslang::TConstUnion::getU64Const(pTVar11);
              }
              else {
                local_458 = 0;
              }
              local_298 = spv::Builder::makeUint64Constant
                                    (&this->builder,local_458,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            case 0xc:
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_3f1 = glslang::TConstUnion::getBConst(pTVar11);
              }
              else {
                local_3f1 = false;
              }
              local_298 = spv::Builder::makeBoolConstant
                                    (&this->builder,local_3f1,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              break;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0x295a,
                            "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType &, const glslang::TConstUnionArray &, int &, bool)"
                           );
            case 0x12:
              if ((local_291 & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_488 = glslang::TConstUnion::getU64Const(pTVar11);
              }
              else {
                local_488 = 0;
              }
              local_298 = spv::Builder::makeUint64Constant
                                    (&this->builder,local_488,
                                     (bool)(spvConsts.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_
                                           & 1));
              local_298 = spv::Builder::createUnaryOp
                                    (&this->builder,OpBitcast,elementType.spirvType._4_4_,local_298)
              ;
              break;
            case 0x1b:
              pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
              this_00 = glslang::TConstUnion::getSConst_abi_cxx11_(pTVar11);
              __s = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str(this_00);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2b8,__s,&local_2b9);
              local_298 = spv::Builder::getStringId(&this->builder,&local_2b8);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::allocator<char>::~allocator(&local_2b9);
            }
            *nextConst = *nextConst + 1;
            this_local._4_4_ = local_298;
            goto LAB_005c60da;
          }
          bVar1 = glslang::TType::isCoopVecNV(glslangType);
          if (bVar1) {
            iVar7 = (*glslangType->_vptr_TType[0x16])();
            local_2d4 = glslang::TArraySizes::getDimSize
                                  (*(TArraySizes **)(CONCAT44(extraout_var,iVar7) + 8),0);
          }
          else {
            local_2d4 = (*glslangType->_vptr_TType[0xc])();
          }
          uStack_258 = local_2d4;
          for (local_25c = 0; local_25c < uStack_258; local_25c = local_25c + 1) {
            iVar7 = *nextConst;
            iVar8 = glslang::TConstUnionArray::size(consts);
            local_25d = iVar8 <= iVar7;
            iVar7 = (*glslangType->_vptr_TType[7])();
            switch(iVar7) {
            case 1:
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                dVar12 = glslang::TConstUnion::getDConst(pTVar11);
                local_314 = (float)dVar12;
              }
              else {
                local_314 = 0.0;
              }
              local_26c = spv::Builder::makeFloatConstant(&this->builder,local_314,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_26c)
              ;
              break;
            case 2:
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_398 = glslang::TConstUnion::getDConst(pTVar11);
              }
              else {
                local_398 = 0.0;
              }
              IStack_28c = spv::Builder::makeDoubleConstant(&this->builder,local_398,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                         &stack0xfffffffffffffd74);
              break;
            case 3:
              spv::Builder::addCapability(&this->builder,CapabilityFloat16);
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                dVar12 = glslang::TConstUnion::getDConst(pTVar11);
                local_3a4 = (float)dVar12;
              }
              else {
                local_3a4 = 0.0;
              }
              scalar = spv::Builder::makeFloat16Constant(&this->builder,local_3a4,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&scalar);
              break;
            case 4:
              spv::Builder::addCapability(&this->builder,CapabilityInt8);
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                cVar2 = glslang::TConstUnion::getI8Const(pTVar11);
                local_334 = (int)cVar2;
              }
              else {
                local_334 = 0;
              }
              local_274 = spv::Builder::makeInt8Constant(&this->builder,local_334,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_274)
              ;
              break;
            case 5:
              spv::Builder::addCapability(&this->builder,CapabilityInt8);
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                bVar3 = glslang::TConstUnion::getU8Const(pTVar11);
                local_344 = (uint)bVar3;
              }
              else {
                local_344 = 0;
              }
              local_278 = spv::Builder::makeUint8Constant(&this->builder,local_344,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_278)
              ;
              break;
            case 6:
              spv::Builder::addCapability(&this->builder,CapabilityInt16);
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                sVar4 = glslang::TConstUnion::getI16Const(pTVar11);
                local_354 = (int)sVar4;
              }
              else {
                local_354 = 0;
              }
              local_27c = spv::Builder::makeInt16Constant(&this->builder,local_354,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_27c)
              ;
              break;
            case 7:
              spv::Builder::addCapability(&this->builder,CapabilityInt16);
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                uVar5 = glslang::TConstUnion::getU16Const(pTVar11);
                local_364 = (uint)uVar5;
              }
              else {
                local_364 = 0;
              }
              local_280 = spv::Builder::makeUint16Constant(&this->builder,local_364,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_280)
              ;
              break;
            case 8:
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_2f4 = glslang::TConstUnion::getIConst(pTVar11);
              }
              else {
                local_2f4 = 0;
              }
              local_264 = spv::Builder::makeIntConstant(&this->builder,local_2f4,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_264)
              ;
              break;
            case 9:
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_304 = glslang::TConstUnion::getUConst(pTVar11);
              }
              else {
                local_304 = 0;
              }
              local_268 = spv::Builder::makeUintConstant(&this->builder,local_304,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_268)
              ;
              break;
            case 10:
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_378 = glslang::TConstUnion::getI64Const(pTVar11);
              }
              else {
                local_378 = 0;
              }
              local_284 = spv::Builder::makeInt64Constant(&this->builder,local_378,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_284)
              ;
              break;
            case 0xb:
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_388 = glslang::TConstUnion::getU64Const(pTVar11);
              }
              else {
                local_388 = 0;
              }
              local_288 = spv::Builder::makeUint64Constant(&this->builder,local_388,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_288)
              ;
              break;
            case 0xc:
              if ((local_25d & 1) == 0) {
                pTVar11 = glslang::TConstUnionArray::operator[](consts,(long)*nextConst);
                local_321 = glslang::TConstUnion::getBConst(pTVar11);
              }
              else {
                local_321 = false;
              }
              local_270 = spv::Builder::makeBoolConstant(&this->builder,local_321,false);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_270)
              ;
              break;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0x291f,
                            "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType &, const glslang::TConstUnionArray &, int &, bool)"
                           );
            }
            *nextConst = *nextConst + 1;
          }
        }
        else {
          __gnu_cxx::
          __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
          ::__normal_iterator(&local_240);
          pvVar9 = &glslang::TType::getStruct(glslangType)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          local_248 = (TTypeLoc *)
                      std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                      begin(pvVar9);
          local_240._M_current = local_248;
          while( true ) {
            pvVar9 = &glslang::TType::getStruct(glslangType)->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
            _numComponents =
                 std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::end
                           (pvVar9);
            bVar1 = __gnu_cxx::operator!=
                              (&local_240,
                               (__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                                *)&numComponents);
            if (!bVar1) break;
            pTVar10 = __gnu_cxx::
                      __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                      ::operator->(&local_240);
            i_1 = createSpvConstantFromConstUnionArray(this,pTVar10->type,consts,nextConst,false);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&i_1);
            __gnu_cxx::
            __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
            ::operator++(&local_240);
          }
        }
      }
    }
    else {
      glslang::TType::TType((TType *)local_190,glslangType,0,false);
      for (componentType.spirvType._4_4_ = 0; iVar7 = componentType.spirvType._4_4_,
          iVar8 = (*glslangType->_vptr_TType[0xd])(), iVar7 < iVar8;
          componentType.spirvType._4_4_ = componentType.spirvType._4_4_ + 1) {
        componentType.spirvType._0_4_ =
             createSpvConstantFromConstUnionArray(this,(TType *)local_190,consts,nextConst,false);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                   (value_type *)&componentType.spirvType);
      }
      glslang::TType::~TType((TType *)local_190);
    }
  }
  else {
    glslang::TType::TType((TType *)local_f0,glslangType,0,false);
    for (vectorType.spirvType._4_4_ = 0; iVar7 = vectorType.spirvType._4_4_,
        iVar8 = (*glslangType->_vptr_TType[0xf])(), iVar7 < iVar8;
        vectorType.spirvType._4_4_ = vectorType.spirvType._4_4_ + 1) {
      vectorType.spirvType._0_4_ =
           createSpvConstantFromConstUnionArray(this,(TType *)local_f0,consts,nextConst,false);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                 (value_type *)&vectorType.spirvType);
    }
    glslang::TType::~TType((TType *)local_f0);
  }
  this_local._4_4_ =
       spv::Builder::makeCompositeConstant
                 (&this->builder,elementType.spirvType._4_4_,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,false);
LAB_005c60da:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSpvConstantFromConstUnionArray(const glslang::TType& glslangType,
    const glslang::TConstUnionArray& consts, int& nextConst, bool specConstant)
{
    // vector of constants for SPIR-V
    std::vector<spv::Id> spvConsts;

    // Type is used for struct and array constants
    spv::Id typeId = convertGlslangToSpvType(glslangType);

    if (glslangType.isArray()) {
        glslang::TType elementType(glslangType, 0);
        for (int i = 0; i < glslangType.getOuterArraySize(); ++i)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(elementType, consts, nextConst, false));
    } else if (glslangType.isMatrix()) {
        glslang::TType vectorType(glslangType, 0);
        for (int col = 0; col < glslangType.getMatrixCols(); ++col)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(vectorType, consts, nextConst, false));
    } else if (glslangType.isCoopMat()) {
        glslang::TType componentType(glslangType.getBasicType());
        spvConsts.push_back(createSpvConstantFromConstUnionArray(componentType, consts, nextConst, false));
    } else if (glslangType.isStruct()) {
        glslang::TVector<glslang::TTypeLoc>::const_iterator iter;
        for (iter = glslangType.getStruct()->begin(); iter != glslangType.getStruct()->end(); ++iter)
            spvConsts.push_back(createSpvConstantFromConstUnionArray(*iter->type, consts, nextConst, false));
    } else if (glslangType.getVectorSize() > 1 || glslangType.isCoopVecNV()) {
        unsigned int numComponents = glslangType.isCoopVecNV() ? glslangType.getTypeParameters()->arraySizes->getDimSize(0) : glslangType.getVectorSize();
        for (unsigned int i = 0; i < numComponents; ++i) {
            bool zero = nextConst >= consts.size();
            switch (glslangType.getBasicType()) {
            case glslang::EbtInt:
                spvConsts.push_back(builder.makeIntConstant(zero ? 0 : consts[nextConst].getIConst()));
                break;
            case glslang::EbtUint:
                spvConsts.push_back(builder.makeUintConstant(zero ? 0 : consts[nextConst].getUConst()));
                break;
            case glslang::EbtFloat:
                spvConsts.push_back(builder.makeFloatConstant(zero ? 0.0F : (float)consts[nextConst].getDConst()));
                break;
            case glslang::EbtBool:
                spvConsts.push_back(builder.makeBoolConstant(zero ? false : consts[nextConst].getBConst()));
                break;
            case glslang::EbtInt8:
                builder.addCapability(spv::CapabilityInt8);
                spvConsts.push_back(builder.makeInt8Constant(zero ? 0 : consts[nextConst].getI8Const()));
                break;
            case glslang::EbtUint8:
                builder.addCapability(spv::CapabilityInt8);
                spvConsts.push_back(builder.makeUint8Constant(zero ? 0 : consts[nextConst].getU8Const()));
                break;
            case glslang::EbtInt16:
                builder.addCapability(spv::CapabilityInt16);
                spvConsts.push_back(builder.makeInt16Constant(zero ? 0 : consts[nextConst].getI16Const()));
                break;
            case glslang::EbtUint16:
                builder.addCapability(spv::CapabilityInt16);
                spvConsts.push_back(builder.makeUint16Constant(zero ? 0 : consts[nextConst].getU16Const()));
                break;
            case glslang::EbtInt64:
                spvConsts.push_back(builder.makeInt64Constant(zero ? 0 : consts[nextConst].getI64Const()));
                break;
            case glslang::EbtUint64:
                spvConsts.push_back(builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const()));
                break;
            case glslang::EbtDouble:
                spvConsts.push_back(builder.makeDoubleConstant(zero ? 0.0 : consts[nextConst].getDConst()));
                break;
            case glslang::EbtFloat16:
                builder.addCapability(spv::CapabilityFloat16);
                spvConsts.push_back(builder.makeFloat16Constant(zero ? 0.0F : (float)consts[nextConst].getDConst()));
                break;
            default:
                assert(0);
                break;
            }
            ++nextConst;
        }
    } else {
        // we have a non-aggregate (scalar) constant
        bool zero = nextConst >= consts.size();
        spv::Id scalar = 0;
        switch (glslangType.getBasicType()) {
        case glslang::EbtInt:
            scalar = builder.makeIntConstant(zero ? 0 : consts[nextConst].getIConst(), specConstant);
            break;
        case glslang::EbtUint:
            scalar = builder.makeUintConstant(zero ? 0 : consts[nextConst].getUConst(), specConstant);
            break;
        case glslang::EbtFloat:
            scalar = builder.makeFloatConstant(zero ? 0.0F : (float)consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtBool:
            scalar = builder.makeBoolConstant(zero ? false : consts[nextConst].getBConst(), specConstant);
            break;
        case glslang::EbtInt8:
            builder.addCapability(spv::CapabilityInt8);
            scalar = builder.makeInt8Constant(zero ? 0 : consts[nextConst].getI8Const(), specConstant);
            break;
        case glslang::EbtUint8:
            builder.addCapability(spv::CapabilityInt8);
            scalar = builder.makeUint8Constant(zero ? 0 : consts[nextConst].getU8Const(), specConstant);
            break;
        case glslang::EbtInt16:
            builder.addCapability(spv::CapabilityInt16);
            scalar = builder.makeInt16Constant(zero ? 0 : consts[nextConst].getI16Const(), specConstant);
            break;
        case glslang::EbtUint16:
            builder.addCapability(spv::CapabilityInt16);
            scalar = builder.makeUint16Constant(zero ? 0 : consts[nextConst].getU16Const(), specConstant);
            break;
        case glslang::EbtInt64:
            scalar = builder.makeInt64Constant(zero ? 0 : consts[nextConst].getI64Const(), specConstant);
            break;
        case glslang::EbtUint64:
            scalar = builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const(), specConstant);
            break;
        case glslang::EbtDouble:
            scalar = builder.makeDoubleConstant(zero ? 0.0 : consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtFloat16:
            builder.addCapability(spv::CapabilityFloat16);
            scalar = builder.makeFloat16Constant(zero ? 0.0F : (float)consts[nextConst].getDConst(), specConstant);
            break;
        case glslang::EbtReference:
            scalar = builder.makeUint64Constant(zero ? 0 : consts[nextConst].getU64Const(), specConstant);
            scalar = builder.createUnaryOp(spv::OpBitcast, typeId, scalar);
            break;
        case glslang::EbtString:
            scalar = builder.getStringId(consts[nextConst].getSConst()->c_str());
            break;
        default:
            assert(0);
            break;
        }
        ++nextConst;
        return scalar;
    }

    return builder.makeCompositeConstant(typeId, spvConsts);
}